

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O0

int __thiscall
Lib::
SkipList<Inferences::ALASCA::FourierMotzkinConf::Lhs,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::LDComparator>
::size(SkipList<Inferences::ALASCA::FourierMotzkinConf::Lhs,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::LDComparator>
       *this)

{
  bool bVar1;
  SkipList<Inferences::ALASCA::FourierMotzkinConf::Lhs,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::LDComparator>
  *in_RDI;
  Iterator *in_stack_00000008;
  Iterator it;
  int res;
  Iterator local_18;
  int local_c;
  
  local_c = 0;
  Iterator::Iterator(&local_18,in_RDI);
  while( true ) {
    bVar1 = Iterator::hasNext(&local_18);
    if (!bVar1) break;
    Iterator::next(in_stack_00000008);
    Inferences::ALASCA::FourierMotzkinConf::Lhs::~Lhs((Lhs *)0x3e3df5);
    local_c = local_c + 1;
  }
  return local_c;
}

Assistant:

int size() const
  {
    int res=0;
    Iterator it(*this);
    while(it.hasNext()) {
      it.next();
      res++;
    }
    return res;
  }